

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tinyexr.h
# Opt level: O1

bool tinyexr::DecompressPiz
               (uchar *outPtr,uchar *inPtr,size_t tmpBufSize,int num_channels,
               EXRChannelInfo *channels,int data_width,int num_lines)

{
  long *plVar1;
  size_t __n;
  ushort uVar2;
  bool bVar3;
  size_t sVar4;
  unsigned_short uVar5;
  int iVar6;
  uint uVar7;
  int iVar8;
  pointer pPVar9;
  ulong uVar10;
  undefined8 uVar11;
  short sVar12;
  int iVar13;
  ushort *puVar14;
  uint uVar15;
  long lVar16;
  uchar *__dest;
  ushort uVar17;
  unsigned_short *puVar18;
  long lVar19;
  ushort *puVar20;
  long lVar21;
  short hs;
  short sVar22;
  ushort uVar23;
  int *piVar24;
  int *piVar25;
  size_type __n_00;
  vector<tinyexr::PIZChannelData,_std::allocator<tinyexr::PIZChannelData>_> channelData;
  vector<unsigned_short,_std::allocator<unsigned_short>_> tmpBuffer;
  uchar bitmap [8192];
  unsigned_short lut [65536];
  allocator_type aStack_22129;
  long lStack_22128;
  int iStack_22120;
  int iStack_2211c;
  vector<tinyexr::PIZChannelData,_std::allocator<tinyexr::PIZChannelData>_> vStack_22118;
  long lStack_22100;
  uint uStack_220f4;
  uint uStack_220f0;
  int iStack_220ec;
  size_t sStack_220e8;
  pointer pPStack_220e0;
  long lStack_220d8;
  ushort *puStack_220d0;
  long lStack_220c8;
  ulong uStack_220c0;
  long lStack_220b8;
  vector<unsigned_short,_std::allocator<unsigned_short>_> vStack_220b0;
  unsigned_short *puStack_22098;
  ulong uStack_22090;
  uchar *puStack_22088;
  long lStack_22080;
  long lStack_22078;
  long lStack_22070;
  ulong uStack_22068;
  long lStack_22060;
  long lStack_22058;
  ushort *puStack_22050;
  long lStack_22048;
  ushort *puStack_22040;
  uchar auStack_22038 [8192];
  unsigned_short auStack_20038 [65540];
  
  sStack_220e8 = tmpBufSize;
  puStack_22088 = outPtr;
  memset(auStack_22038,0,0x2000);
  uVar2 = *(ushort *)(inPtr + 2);
  uStack_22090 = (ulong)uVar2;
  uVar15 = (uint)uVar2;
  if (0x1fff < uStack_22090) {
LAB_00127a12:
    return uVar15 < 0x2000;
  }
  uVar17 = *(ushort *)inPtr;
  piVar25 = (int *)(inPtr + 4);
  if (uVar17 <= uVar2) {
    lVar16 = uStack_22090 - uVar17;
    memcpy(auStack_22038 + uVar17,piVar25,lVar16 + 1);
    piVar25 = (int *)((long)piVar25 + lVar16 + 1);
  }
  memset(auStack_20038,0,0x20000);
  uVar5 = reverseLutFromBitmap(auStack_22038,auStack_20038);
  sVar4 = sStack_220e8;
  iVar8 = *piVar25;
  std::vector<unsigned_short,_std::allocator<unsigned_short>_>::vector
            (&vStack_220b0,sStack_220e8,(allocator_type *)&vStack_22118);
  if (vStack_220b0.super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
      super__Vector_impl_data._M_finish ==
      vStack_220b0.super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
      super__Vector_impl_data._M_start) {
    std::__throw_out_of_range_fmt
              ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)",0,0);
  }
  else {
    hufUncompress((char *)(piVar25 + 1),iVar8,
                  vStack_220b0.super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>.
                  _M_impl.super__Vector_impl_data._M_start,(int)sVar4);
    __n_00 = (size_type)num_channels;
    std::vector<tinyexr::PIZChannelData,_std::allocator<tinyexr::PIZChannelData>_>::vector
              (&vStack_22118,__n_00,&aStack_22129);
    if (vStack_220b0.super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
        super__Vector_impl_data._M_finish !=
        vStack_220b0.super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
        super__Vector_impl_data._M_start) {
      if (num_channels != 0) {
        piVar24 = &channels->pixel_type;
        piVar25 = &(vStack_22118.
                    super__Vector_base<tinyexr::PIZChannelData,_std::allocator<tinyexr::PIZChannelData>_>
                    ._M_impl.super__Vector_impl_data._M_start)->size;
        puVar18 = vStack_220b0.super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>.
                  _M_impl.super__Vector_impl_data._M_start;
        do {
          iVar8 = *piVar24;
          ((PIZChannelData *)(piVar25 + -7))->start = puVar18;
          *(unsigned_short **)(piVar25 + -5) = puVar18;
          piVar25[-3] = data_width;
          piVar25[-2] = num_lines;
          *piVar25 = (iVar8 != 1) + 1;
          puVar18 = puVar18 + (num_lines * data_width << (iVar8 != 1));
          piVar24 = piVar24 + 0x44;
          piVar25 = piVar25 + 8;
          __n_00 = __n_00 - 1;
        } while (__n_00 != 0);
      }
      puStack_22098 =
           vStack_220b0.super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
           super__Vector_impl_data._M_start;
      pPStack_220e0 =
           vStack_22118.
           super__Vector_base<tinyexr::PIZChannelData,_std::allocator<tinyexr::PIZChannelData>_>.
           _M_impl.super__Vector_impl_data._M_start;
      if ((long)vStack_22118.
                super__Vector_base<tinyexr::PIZChannelData,_std::allocator<tinyexr::PIZChannelData>_>
                ._M_impl.super__Vector_impl_data._M_finish -
          (long)vStack_22118.
                super__Vector_base<tinyexr::PIZChannelData,_std::allocator<tinyexr::PIZChannelData>_>
                ._M_impl.super__Vector_impl_data._M_start != 0) {
        lStack_22080 = (long)vStack_22118.
                             super__Vector_base<tinyexr::PIZChannelData,_std::allocator<tinyexr::PIZChannelData>_>
                             ._M_impl.super__Vector_impl_data._M_finish -
                       (long)vStack_22118.
                             super__Vector_base<tinyexr::PIZChannelData,_std::allocator<tinyexr::PIZChannelData>_>
                             ._M_impl.super__Vector_impl_data._M_start >> 5;
        lStack_22080 = lStack_22080 + (ulong)(lStack_22080 == 0);
        lVar16 = 0;
        do {
          lStack_22078 = lVar16;
          iVar8 = vStack_22118.
                  super__Vector_base<tinyexr::PIZChannelData,_std::allocator<tinyexr::PIZChannelData>_>
                  ._M_impl.super__Vector_impl_data._M_start[lStack_22078].size;
          lStack_22128 = (long)iVar8;
          if (0 < lStack_22128) {
            pPVar9 = vStack_22118.
                     super__Vector_base<tinyexr::PIZChannelData,_std::allocator<tinyexr::PIZChannelData>_>
                     ._M_impl.super__Vector_impl_data._M_start + lStack_22078;
            puVar18 = pPVar9->start;
            uVar15 = pPVar9->nx;
            uStack_220f0 = pPVar9->ny;
            iStack_22120 = uVar15 * iVar8;
            uStack_220f4 = uStack_220f0;
            if ((int)uVar15 < (int)uStack_220f0) {
              uStack_220f4 = uVar15;
            }
            lStack_220d8 = 0;
            lStack_22100 = 0;
            do {
              iVar13 = 1;
              do {
                iVar6 = iVar13;
                iVar13 = iVar6 * 2;
              } while (iVar6 <= (int)uStack_220f4);
              if (0 < iVar6 >> 2) {
                puStack_220d0 = puVar18 + lStack_22100;
                uVar10 = (ulong)(uint)(iVar6 >> 1);
                uVar7 = iVar6 >> 2;
                do {
                  iStack_2211c = (int)uVar10;
                  iVar13 = (uStack_220f0 - iStack_2211c) * iStack_22120;
                  uStack_220c0 = (ulong)(uVar7 * iVar8);
                  lStack_220c8 = (long)(iStack_2211c * iVar8);
                  puVar20 = puStack_220d0;
                  if (-1 < iVar13) {
                    puStack_22050 = puStack_220d0 + iVar13;
                    iStack_220ec = (uVar15 - iStack_2211c) * iVar8;
                    lStack_22070 = (long)iStack_220ec;
                    lStack_220b8 = (long)(int)(uVar7 * iStack_22120);
                    lStack_22058 = (long)(iStack_2211c * iStack_22120);
                    lStack_22060 = lStack_22058 * 2;
                    lVar16 = uStack_220c0 * 2 + lStack_220b8 * 2;
                    lVar21 = lStack_220d8;
                    do {
                      puVar14 = puVar20;
                      if (-1 < iStack_220ec) {
                        lVar19 = lVar21;
                        do {
                          uVar2 = *(ushort *)((long)puVar18 + lVar19 + lStack_220b8 * 2);
                          if (uVar5 < 0x4000) {
                            sVar12 = ((short)uVar2 >> 1) +
                                     *(short *)((long)puVar18 + lVar19) + (uVar2 & 1);
                            uVar17 = *(ushort *)((long)puVar18 + lVar19 + lVar16);
                            uVar23 = ((short)uVar17 >> 1) +
                                     (uVar17 & 1) +
                                     *(short *)((long)puVar18 + lVar19 + uStack_220c0 * 2);
                            sVar22 = ((short)uVar23 >> 1) + (uVar23 & 1) + sVar12;
                            *(short *)((long)puVar18 + lVar19) = sVar22;
                            uVar17 = uVar23 - uVar17;
                            *(ushort *)((long)puVar18 + lVar19 + uStack_220c0 * 2) = sVar22 - uVar23
                            ;
                            sVar12 = ((short)uVar17 >> 1) + (uVar17 & 1) + (sVar12 - uVar2);
                            *(short *)((long)puVar18 + lVar19 + lStack_220b8 * 2) = sVar12;
                            *(ushort *)((long)puVar18 + lVar19 + lVar16) = sVar12 - uVar17;
                          }
                          else {
                            sVar12 = *(short *)((long)puVar18 + lVar19) - (uVar2 >> 1);
                            uVar17 = *(ushort *)((long)puVar18 + lVar19 + lVar16);
                            uVar23 = *(short *)((long)puVar18 + lVar19 + uStack_220c0 * 2) -
                                     (uVar17 >> 1);
                            uVar17 = uVar17 + uVar23 ^ 0x8000;
                            sVar22 = (sVar12 + uVar2 ^ 0x8000) - (uVar17 >> 1);
                            *(short *)((long)puVar18 + lVar19 + uStack_220c0 * 2) = sVar22;
                            *(ushort *)((long)puVar18 + lVar19) = sVar22 + uVar17 ^ 0x8000;
                            sVar12 = sVar12 - (uVar23 >> 1);
                            *(short *)((long)puVar18 + lVar19 + lVar16) = sVar12;
                            *(ushort *)((long)puVar18 + lVar19 + lStack_220b8 * 2) =
                                 sVar12 + uVar23 ^ 0x8000;
                          }
                          lVar19 = lVar19 + lStack_220c8 * 2;
                          puVar14 = (ushort *)((long)puVar18 + lVar19);
                          lStack_22048 = lVar21;
                          puStack_22040 = puVar20;
                        } while (puVar14 <= puVar20 + lStack_22070);
                      }
                      if ((uVar15 & uVar7) != 0) {
                        uVar2 = puVar14[lStack_220b8];
                        if (uVar5 < 0x4000) {
                          uVar23 = ((short)uVar2 >> 1) + *puVar14 + (uVar2 & 1);
                          uVar17 = uVar23 - uVar2;
                        }
                        else {
                          uVar17 = *puVar14 - (uVar2 >> 1);
                          uVar23 = uVar17 + uVar2 ^ 0x8000;
                        }
                        puVar14[lStack_220b8] = uVar17;
                        *puVar14 = uVar23;
                      }
                      puVar20 = puVar20 + lStack_22058;
                      lVar21 = lVar21 + lStack_22060;
                      uStack_22068 = (ulong)uVar7;
                    } while (puVar20 <= puStack_22050);
                  }
                  if (((uVar7 & uStack_220f0) != 0) &&
                     (iVar13 = (uVar15 - iStack_2211c) * iVar8, -1 < iVar13)) {
                    puVar14 = puVar20 + iVar13;
                    do {
                      uVar2 = puVar20[uStack_220c0];
                      if (uVar5 < 0x4000) {
                        uVar23 = ((short)uVar2 >> 1) + *puVar20 + (uVar2 & 1);
                        uVar17 = uVar23 - uVar2;
                      }
                      else {
                        uVar17 = *puVar20 - (uVar2 >> 1);
                        uVar23 = uVar17 + uVar2 ^ 0x8000;
                      }
                      puVar20[uStack_220c0] = uVar17;
                      *puVar20 = uVar23;
                      puVar20 = puVar20 + lStack_220c8;
                    } while (puVar20 <= puVar14);
                  }
                  bVar3 = 1 < uVar7;
                  uVar10 = (ulong)uVar7;
                  uVar7 = uVar7 >> 1;
                } while (bVar3);
              }
              lStack_22100 = lStack_22100 + 1;
              lStack_220d8 = lStack_220d8 + 2;
            } while (lStack_22100 != lStack_22128);
          }
          lVar16 = lStack_22078 + 1;
        } while (lStack_22078 + 1 != lStack_22080);
      }
      if (0 < (int)(uint)sStack_220e8) {
        uVar10 = 0;
        do {
          vStack_220b0.super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
          super__Vector_impl_data._M_start[uVar10] =
               auStack_20038
               [vStack_220b0.super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>.
                _M_impl.super__Vector_impl_data._M_start[uVar10]];
          uVar10 = uVar10 + 1;
        } while (((uint)sStack_220e8 & 0x7fffffff) != uVar10);
      }
      if (0 < num_lines) {
        iVar8 = 0;
        __dest = puStack_22088;
        do {
          if (vStack_22118.
              super__Vector_base<tinyexr::PIZChannelData,_std::allocator<tinyexr::PIZChannelData>_>.
              _M_impl.super__Vector_impl_data._M_finish !=
              vStack_22118.
              super__Vector_base<tinyexr::PIZChannelData,_std::allocator<tinyexr::PIZChannelData>_>.
              _M_impl.super__Vector_impl_data._M_start) {
            lVar16 = 8;
            uVar10 = 0;
            do {
              pPVar9 = vStack_22118.
                       super__Vector_base<tinyexr::PIZChannelData,_std::allocator<tinyexr::PIZChannelData>_>
                       ._M_impl.super__Vector_impl_data._M_start;
              lVar21 = (long)*(int *)((long)&(vStack_22118.
                                              super__Vector_base<tinyexr::PIZChannelData,_std::allocator<tinyexr::PIZChannelData>_>
                                              ._M_impl.super__Vector_impl_data._M_start)->ny +
                                     lVar16) *
                       (long)*(int *)((long)&(vStack_22118.
                                              super__Vector_base<tinyexr::PIZChannelData,_std::allocator<tinyexr::PIZChannelData>_>
                                              ._M_impl.super__Vector_impl_data._M_start)->end +
                                     lVar16);
              __n = lVar21 * 2;
              memcpy(__dest,*(void **)((long)&(vStack_22118.
                                               super__Vector_base<tinyexr::PIZChannelData,_std::allocator<tinyexr::PIZChannelData>_>
                                               ._M_impl.super__Vector_impl_data._M_start)->start +
                                      lVar16),__n);
              plVar1 = (long *)((long)&pPVar9->start + lVar16);
              *plVar1 = *plVar1 + __n;
              __dest = __dest + lVar21 * 2;
              uVar10 = uVar10 + 1;
              lVar16 = lVar16 + 0x20;
            } while (uVar10 < (ulong)((long)vStack_22118.
                                            super__Vector_base<tinyexr::PIZChannelData,_std::allocator<tinyexr::PIZChannelData>_>
                                            ._M_impl.super__Vector_impl_data._M_finish -
                                      (long)vStack_22118.
                                            super__Vector_base<tinyexr::PIZChannelData,_std::allocator<tinyexr::PIZChannelData>_>
                                            ._M_impl.super__Vector_impl_data._M_start >> 5));
          }
          iVar8 = iVar8 + 1;
        } while (iVar8 != num_lines);
      }
      if (vStack_22118.
          super__Vector_base<tinyexr::PIZChannelData,_std::allocator<tinyexr::PIZChannelData>_>.
          _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(vStack_22118.
                        super__Vector_base<tinyexr::PIZChannelData,_std::allocator<tinyexr::PIZChannelData>_>
                        ._M_impl.super__Vector_impl_data._M_start,
                        (long)vStack_22118.
                              super__Vector_base<tinyexr::PIZChannelData,_std::allocator<tinyexr::PIZChannelData>_>
                              ._M_impl.super__Vector_impl_data._M_end_of_storage -
                        (long)vStack_22118.
                              super__Vector_base<tinyexr::PIZChannelData,_std::allocator<tinyexr::PIZChannelData>_>
                              ._M_impl.super__Vector_impl_data._M_start);
      }
      uVar15 = (uint)uStack_22090;
      if (vStack_220b0.super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
          super__Vector_impl_data._M_start != (unsigned_short *)0x0) {
        operator_delete(vStack_220b0.
                        super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
                        super__Vector_impl_data._M_start,
                        (long)vStack_220b0.
                              super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>.
                              _M_impl.super__Vector_impl_data._M_end_of_storage -
                        (long)vStack_220b0.
                              super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>.
                              _M_impl.super__Vector_impl_data._M_start);
      }
      goto LAB_00127a12;
    }
  }
  uVar11 = std::__throw_out_of_range_fmt
                     ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)",0,
                      0);
  if (vStack_22118.
      super__Vector_base<tinyexr::PIZChannelData,_std::allocator<tinyexr::PIZChannelData>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(vStack_22118.
                    super__Vector_base<tinyexr::PIZChannelData,_std::allocator<tinyexr::PIZChannelData>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)vStack_22118.
                          super__Vector_base<tinyexr::PIZChannelData,_std::allocator<tinyexr::PIZChannelData>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)vStack_22118.
                          super__Vector_base<tinyexr::PIZChannelData,_std::allocator<tinyexr::PIZChannelData>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  if (vStack_220b0.super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
      super__Vector_impl_data._M_start != (unsigned_short *)0x0) {
    operator_delete(vStack_220b0.super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)vStack_220b0.
                          super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)vStack_220b0.
                          super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>.
                          _M_impl.super__Vector_impl_data._M_start);
  }
  _Unwind_Resume(uVar11);
}

Assistant:

bool DecompressPiz(unsigned char *outPtr, const unsigned char *inPtr,
                   size_t tmpBufSize, int num_channels,
                   const EXRChannelInfo *channels, int data_width,
                   int num_lines) {
  unsigned char bitmap[BITMAP_SIZE];
  unsigned short minNonZero;
  unsigned short maxNonZero;

#if !MINIZ_LITTLE_ENDIAN
  // @todo { PIZ compression on BigEndian architecture. }
  assert(0);
  return false;
#endif

  memset(bitmap, 0, BITMAP_SIZE);

  const unsigned char *ptr = inPtr;
  minNonZero = *(reinterpret_cast<const unsigned short *>(ptr));
  maxNonZero = *(reinterpret_cast<const unsigned short *>(ptr + 2));
  ptr += 4;

  if (maxNonZero >= BITMAP_SIZE) {
    return false;
  }

  if (minNonZero <= maxNonZero) {
    memcpy((char *)&bitmap[0] + minNonZero, ptr, maxNonZero - minNonZero + 1);
    ptr += maxNonZero - minNonZero + 1;
  }

  unsigned short lut[USHORT_RANGE];
  memset(lut, 0, sizeof(unsigned short) * USHORT_RANGE);
  unsigned short maxValue = reverseLutFromBitmap(bitmap, lut);

  //
  // Huffman decoding
  //

  int length;

  length = *(reinterpret_cast<const int *>(ptr));
  ptr += sizeof(int);

  std::vector<unsigned short> tmpBuffer(tmpBufSize);
  hufUncompress(reinterpret_cast<const char *>(ptr), length, &tmpBuffer.at(0),
                tmpBufSize);

  //
  // Wavelet decoding
  //

  std::vector<PIZChannelData> channelData(num_channels);

  unsigned short *tmpBufferEnd = &tmpBuffer.at(0);

  for (size_t i = 0; i < static_cast<size_t>(num_channels); ++i) {
    const EXRChannelInfo &chan = channels[i];

    int pixelSize = sizeof(int);  // UINT and FLOAT
    if (chan.pixel_type == TINYEXR_PIXELTYPE_HALF) {
      pixelSize = sizeof(short);
    }

    channelData[i].start = tmpBufferEnd;
    channelData[i].end = channelData[i].start;
    channelData[i].nx = data_width;
    channelData[i].ny = num_lines;
    // channelData[i].ys = 1;
    channelData[i].size = pixelSize / sizeof(short);

    tmpBufferEnd += channelData[i].nx * channelData[i].ny * channelData[i].size;
  }

  for (size_t i = 0; i < channelData.size(); ++i) {
    PIZChannelData &cd = channelData[i];

    for (int j = 0; j < cd.size; ++j) {
      wav2Decode(cd.start + j, cd.nx, cd.size, cd.ny, cd.nx * cd.size,
                 maxValue);
    }
  }

  //
  // Expand the pixel data to their original range
  //

  applyLut(lut, &tmpBuffer.at(0), tmpBufSize);

  for (int y = 0; y < num_lines; y++) {
    for (size_t i = 0; i < channelData.size(); ++i) {
      PIZChannelData &cd = channelData[i];

      // if (modp (y, cd.ys) != 0)
      //    continue;

      int n = cd.nx * cd.size;
      memcpy(outPtr, cd.end, n * sizeof(unsigned short));
      outPtr += n * sizeof(unsigned short);
      cd.end += n;
    }
  }

  return true;
}